

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O2

int __thiscall andyzip::brotli_decoder::read_256(brotli_decoder *this,brotli_decoder_state *s)

{
  ssize_t sVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  int iVar3;
  
  iVar3 = 1;
  sVar1 = brotli_decoder_state::read(s,1,in_RDX,in_RCX);
  if (s->error == ok) {
    if ((int)sVar1 != 0) {
      sVar1 = brotli_decoder_state::read(s,3,__buf,in_RCX);
      iVar3 = 0;
      if (s->error == ok) {
        if ((int)sVar1 == 0) {
          iVar3 = 2;
        }
        else {
          sVar2 = brotli_decoder_state::read(s,(int)sVar1,__buf_00,in_RCX);
          iVar3 = (1 << ((byte)sVar1 & 0x1f)) + 1 + (int)sVar2;
          if (s->error != ok) {
            iVar3 = 0;
          }
        }
      }
    }
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int read_256(brotli_decoder_state &s) {
      int nlt0 = s.read(1);
      if (s.error != error_code::ok) return 0; 

      if (!nlt0) return 1;

      int nlt14 = s.read(3);
      if (s.error != error_code::ok) return 0; 

      if (!nlt14) return 2;

      int nlt5x = s.read(nlt14);
      if (s.error != error_code::ok) return 0; 

      return (1 << nlt14) + nlt5x + 1;
    }